

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_files.cpp
# Opt level: O1

void create_files(stringstream *ss)

{
  uint uVar1;
  time_t tVar2;
  ostream *poVar3;
  int i;
  long lVar4;
  int seed [10];
  string local_78;
  uint auStack_58 [10];
  
  lVar4 = 0;
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  do {
    uVar1 = rand();
    auStack_58[lVar4] = uVar1 & 10000;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 10);
  lVar4 = 1;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(ss + 0x10),"..\\Files\\",9);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)(ss + 0x10),(int)lVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,".txt",4);
    std::__cxx11::stringbuf::str();
    populateFile(&local_78,auStack_58[lVar4]);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringbuf::str((string *)(ss + 0x18));
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0xb);
  return;
}

Assistant:

void create_files(std::stringstream &ss) {
    srand(time(NULL));
    int seed[N];
    for (int i = 0; i < 10; ++i) {
        seed[i] = rand() & 10000;
    }
    for (int i = 1; i <= 10; i++) {
        ss << "..\\Files\\" << i << ".txt";
        populateFile(ss.str(), seed[i]);
        ss.str(std::string());
    }
}